

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeeki.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int local_140;
  uint local_13c;
  int j;
  int s;
  uint32_t z [64];
  uint32_t selector;
  int ls;
  int32_t i;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    b = 0;
    while (a = getopt((int)argv_local,_cnum,"c:"), a != -1) {
      if (a == 99) {
        __isoc99_sscanf(_optarg,"%d",&b);
      }
    }
    if (b < nva_cardsnum) {
      ls = 4;
      if (_optind < (int)argv_local) {
        __isoc99_sscanf(_cnum[_optind],"%x",&i);
        i = i & 0xfffffffc;
        if (_optind + 1 < (int)argv_local) {
          __isoc99_sscanf(_cnum[_optind + 1],"%x",&ls);
        }
        bVar1 = true;
        for (; 0 < ls; ls = ls + -4) {
          z[0x3f] = i | 0xffc;
          local_13c = 0;
          for (selector = 0; (int)selector < 0x40; selector = selector + 1) {
            nva_wr32(b,z[0x3f],selector);
            uVar3 = nva_rd32(b,i);
            (&j)[(int)selector] = uVar3;
            if (uVar3 != 0) {
              local_13c = 1 << ((byte)((int)selector / 4) & 0x1f) | local_13c;
            }
          }
          nva_wr32(b,z[0x3f],0);
          for (local_140 = 0; local_140 < 0x10; local_140 = local_140 + 1) {
            if ((local_13c & 1 << ((byte)local_140 & 0x1f)) == 0) {
              if (bVar1) {
                printf("...\n");
                bVar1 = false;
              }
            }
            else {
              bVar1 = true;
              printf("%08x.%02x:",(ulong)(uint)i,(ulong)(uint)(local_140 << 4));
              for (selector = 0; (int)selector < 4 && (int)selector < ls; selector = selector + 1) {
                printf(" %08x",(ulong)(uint)(&j)[(int)(selector + local_140 * 4)]);
              }
              printf("\n");
            }
          }
          i = i + 4;
        }
        argv_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"No address specified.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	a &= ~3;
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	while (b > 0) {
		uint32_t selector = a|0xffc;
		uint32_t z[0x40];
		int s = 0, j;
		for (i = 0; i < 0x40; i++) {
			nva_wr32(cnum, selector, i);
			if ((z[i] = nva_rd32(cnum, a))) s |= 1 << (i/4);
		}
		nva_wr32(cnum, selector, 0);
		for (j = 0; j < 0x10; ++j) {
			if (s & (1<<j)) {
				ls = 1;
				printf ("%08x.%02x:", a, j * 0x10);
				for (i = 0; i < 4 && i < b; i++) {
					printf (" %08x", z[i + j*4]);
				}
				printf ("\n");
			} else  {
				if (ls) printf ("...\n"), ls = 0;
			}
		}
		a+=4;
		b-=4;
	}
	return 0;
}